

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uchar *__n;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  undefined8 uStack_420;
  uchar local_418;
  byte local_417;
  uchar local_416 [1030];
  
  if (mode == 1) {
    if (ctx->padding != 0) {
      return -0x4080;
    }
    sVar6 = ctx->len;
    if (sVar6 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
    uStack_420 = 0x1415f8;
    iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,&local_418);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_417 = local_417 ^ 2;
    uVar5 = 0;
    sVar4 = 3;
    uVar3 = 0;
    do {
      uVar5 = *(char *)((long)&uStack_420 + sVar4 + 7) == '\0' | uVar5;
      uVar3 = uVar3 + ((-uVar5 & 0xff) >> 7 ^ 1);
      sVar4 = sVar4 + 1;
    } while (sVar6 != sVar4);
  }
  else {
    sVar6 = ctx->len;
    if (sVar6 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
    if (mode == 0) {
      uStack_420 = 0x141685;
      iVar2 = mbedtls_rsa_public(ctx,input,&local_418);
    }
    else {
      uStack_420 = 0x141678;
      iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,&local_418);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    local_417 = local_417 ^ 1;
    bVar1 = false;
    sVar4 = 3;
    uVar3 = 0;
    do {
      bVar1 = (bool)(bVar1 | *(char *)((long)&uStack_420 + sVar4 + 7) != -1);
      uVar3 = uVar3 + !bVar1;
      sVar4 = sVar4 + 1;
    } while (sVar6 != sVar4);
  }
  iVar2 = -0x4100;
  if (7 < uVar3 && ((local_417 == 0 && local_416[uVar3] == '\0') && local_418 == '\0')) {
    __n = &local_418 + (sVar6 - (long)(local_416 + uVar3 + 1));
    iVar2 = -0x4400;
    if (__n <= output_max_len) {
      *olen = (size_t)__n;
      uStack_420 = 0x14170b;
      memcpy(output,local_416 + uVar3 + 1,(size_t)__n);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t *olen,
                                 const unsigned char *input,
                                 unsigned char *output,
                                 size_t output_max_len)
{
    int ret;
    size_t ilen, pad_count = 0, i;
    unsigned char *p, bad, pad_done = 0;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        return( ret );

    p = buf;
    bad = 0;

    /*
     * Check and get padding len in "constant-time"
     */
    bad |= *p++; /* First byte must be 0 */

    /* This test does not depend on secret data */
    if( mode == MBEDTLS_RSA_PRIVATE )
    {
        bad |= *p++ ^ MBEDTLS_RSA_CRYPT;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done  |= ((p[i] | (unsigned char)-p[i]) >> 7) ^ 1;
            pad_count += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }
    else
    {
        bad |= *p++ ^ MBEDTLS_RSA_SIGN;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done |= ( p[i] != 0xFF );
            pad_count += ( pad_done == 0 );
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }

    bad |= ( pad_count < 8 );

    if( bad )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( ilen - ( p - buf ) > output_max_len )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );

    return( 0 );
}